

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O1

void Eigen::internal::
     general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_1,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_false,_0>
     ::run(long rows,long cols,const_blas_data_mapper<double,_long,_1> *alhs,
          const_blas_data_mapper<double,_long,_0> *rhs,ResScalar *res,long resIncr,ResScalar alpha)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  double *pdVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double *local_80;
  double *local_78;
  double *local_70;
  double *local_68;
  
  pdVar10 = (alhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_data;
  lVar2 = (alhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_stride;
  if (rows < 8 || 32000 < (ulong)(lVar2 * 8)) {
    uVar5 = 0;
  }
  else {
    pdVar8 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0,_1>).m_data;
    pdVar6 = pdVar10 + lVar2 * 7;
    pdVar13 = pdVar10 + lVar2 * 3;
    pdVar18 = pdVar10 + lVar2 * 6;
    local_68 = pdVar10 + lVar2 * 5;
    local_70 = pdVar10 + lVar2 * 4;
    local_78 = pdVar10 + lVar2 * 2;
    local_80 = pdVar10 + lVar2;
    uVar5 = 0;
    pdVar17 = pdVar10;
    do {
      if (cols < 2) {
        dVar34 = 0.0;
        dVar35 = 0.0;
        dVar20 = 0.0;
        dVar21 = 0.0;
        dVar22 = 0.0;
        dVar23 = 0.0;
        dVar24 = 0.0;
        dVar25 = 0.0;
        dVar26 = 0.0;
        dVar27 = 0.0;
        dVar28 = 0.0;
        dVar29 = 0.0;
        dVar30 = 0.0;
        dVar31 = 0.0;
        dVar32 = 0.0;
        dVar33 = 0.0;
        lVar7 = 0;
      }
      else {
        dVar32 = 0.0;
        dVar33 = 0.0;
        dVar30 = 0.0;
        dVar31 = 0.0;
        dVar28 = 0.0;
        dVar29 = 0.0;
        dVar26 = 0.0;
        dVar27 = 0.0;
        dVar24 = 0.0;
        dVar25 = 0.0;
        dVar22 = 0.0;
        dVar23 = 0.0;
        dVar20 = 0.0;
        dVar21 = 0.0;
        dVar34 = 0.0;
        dVar35 = 0.0;
        lVar11 = 0;
        do {
          pdVar1 = pdVar8 + lVar11;
          dVar3 = *pdVar1;
          dVar4 = pdVar1[1];
          dVar32 = dVar32 + pdVar17[lVar11] * dVar3;
          dVar33 = dVar33 + (pdVar17 + lVar11)[1] * dVar4;
          dVar30 = dVar30 + pdVar17[lVar11 + lVar2] * dVar3;
          dVar31 = dVar31 + (pdVar17 + lVar11 + lVar2)[1] * dVar4;
          dVar28 = dVar28 + pdVar17[lVar11 + lVar2 * 2] * dVar3;
          dVar29 = dVar29 + (pdVar17 + lVar11 + lVar2 * 2)[1] * dVar4;
          dVar26 = dVar26 + pdVar17[lVar11 + lVar2 * 3] * dVar3;
          dVar27 = dVar27 + (pdVar17 + lVar11 + lVar2 * 3)[1] * dVar4;
          dVar24 = dVar24 + pdVar17[lVar11 + lVar2 * 4] * dVar3;
          dVar25 = dVar25 + (pdVar17 + lVar11 + lVar2 * 4)[1] * dVar4;
          dVar22 = dVar22 + pdVar17[lVar11 + lVar2 * 5] * dVar3;
          dVar23 = dVar23 + (pdVar17 + lVar11 + lVar2 * 5)[1] * dVar4;
          dVar20 = dVar20 + pdVar17[lVar11 + lVar2 * 6] * dVar3;
          dVar21 = dVar21 + (pdVar17 + lVar11 + lVar2 * 6)[1] * dVar4;
          dVar34 = dVar34 + pdVar17[lVar11 + lVar2 * 7] * dVar3;
          dVar35 = dVar35 + (pdVar17 + lVar11 + lVar2 * 7)[1] * dVar4;
          lVar7 = lVar11 + 2;
          lVar9 = lVar11 + 4;
          lVar11 = lVar7;
        } while (lVar9 <= cols);
      }
      dVar33 = dVar33 + dVar32;
      dVar31 = dVar31 + dVar30;
      dVar29 = dVar29 + dVar28;
      dVar27 = dVar27 + dVar26;
      dVar25 = dVar25 + dVar24;
      dVar23 = dVar23 + dVar22;
      dVar21 = dVar21 + dVar20;
      dVar35 = dVar35 + dVar34;
      if (lVar7 < cols) {
        lVar11 = 0;
        do {
          dVar20 = pdVar8[lVar7 + lVar11];
          dVar33 = dVar33 + pdVar17[lVar7 + lVar11] * dVar20;
          dVar31 = dVar31 + local_80[lVar7 + lVar11] * dVar20;
          dVar29 = dVar29 + local_78[lVar7 + lVar11] * dVar20;
          dVar27 = dVar27 + pdVar13[lVar7 + lVar11] * dVar20;
          dVar25 = dVar25 + local_70[lVar7 + lVar11] * dVar20;
          dVar23 = dVar23 + local_68[lVar7 + lVar11] * dVar20;
          dVar21 = dVar21 + pdVar18[lVar7 + lVar11] * dVar20;
          dVar35 = dVar35 + dVar20 * pdVar6[lVar7 + lVar11];
          lVar11 = lVar11 + 1;
        } while (cols - lVar7 != lVar11);
      }
      lVar19 = uVar5 * resIncr;
      lVar7 = (uVar5 | 1) * resIncr;
      lVar14 = (uVar5 | 2) * resIncr;
      lVar12 = (uVar5 | 3) * resIncr;
      lVar15 = (uVar5 | 4) * resIncr;
      lVar16 = (uVar5 | 5) * resIncr;
      lVar9 = (uVar5 | 6) * resIncr;
      lVar11 = (uVar5 | 7) * resIncr;
      uVar5 = uVar5 + 8;
      res[lVar19] = dVar33 * alpha + res[lVar19];
      res[lVar7] = dVar31 * alpha + res[lVar7];
      res[lVar14] = dVar29 * alpha + res[lVar14];
      res[lVar12] = dVar27 * alpha + res[lVar12];
      res[lVar15] = dVar25 * alpha + res[lVar15];
      res[lVar16] = dVar23 * alpha + res[lVar16];
      res[lVar9] = dVar21 * alpha + res[lVar9];
      res[lVar11] = dVar35 * alpha + res[lVar11];
      if (32000 < (ulong)(lVar2 * 8)) break;
      pdVar17 = pdVar17 + lVar2 * 8;
      pdVar6 = pdVar6 + lVar2 * 8;
      pdVar18 = pdVar18 + lVar2 * 8;
      local_68 = local_68 + lVar2 * 8;
      local_70 = local_70 + lVar2 * 8;
      pdVar13 = pdVar13 + lVar2 * 8;
      local_78 = local_78 + lVar2 * 8;
      local_80 = local_80 + lVar2 * 8;
    } while ((long)uVar5 < rows + -7);
  }
  if ((long)uVar5 < rows + -3) {
    pdVar18 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0,_1>).m_data;
    pdVar13 = pdVar10 + uVar5 * lVar2;
    pdVar8 = pdVar10 + (uVar5 + 1) * lVar2;
    pdVar17 = pdVar10 + (uVar5 + 2) * lVar2;
    pdVar6 = pdVar10 + (uVar5 + 3) * lVar2;
    do {
      if (cols < 2) {
        dVar26 = 0.0;
        dVar35 = 0.0;
        dVar20 = 0.0;
        dVar21 = 0.0;
        dVar22 = 0.0;
        dVar23 = 0.0;
        dVar24 = 0.0;
        dVar25 = 0.0;
        lVar7 = 0;
      }
      else {
        dVar24 = 0.0;
        dVar25 = 0.0;
        dVar22 = 0.0;
        dVar23 = 0.0;
        dVar20 = 0.0;
        dVar21 = 0.0;
        dVar26 = 0.0;
        dVar35 = 0.0;
        lVar11 = 0;
        do {
          pdVar1 = pdVar18 + lVar11;
          dVar27 = *pdVar1;
          dVar28 = pdVar1[1];
          dVar24 = dVar24 + pdVar13[lVar11] * dVar27;
          dVar25 = dVar25 + (pdVar13 + lVar11)[1] * dVar28;
          dVar22 = dVar22 + pdVar8[lVar11] * dVar27;
          dVar23 = dVar23 + (pdVar8 + lVar11)[1] * dVar28;
          dVar20 = dVar20 + pdVar17[lVar11] * dVar27;
          dVar21 = dVar21 + (pdVar17 + lVar11)[1] * dVar28;
          dVar26 = dVar26 + pdVar6[lVar11] * dVar27;
          dVar35 = dVar35 + (pdVar6 + lVar11)[1] * dVar28;
          lVar7 = lVar11 + 2;
          lVar9 = lVar11 + 4;
          lVar11 = lVar7;
        } while (lVar9 <= cols);
      }
      dVar25 = dVar25 + dVar24;
      dVar23 = dVar23 + dVar22;
      dVar21 = dVar21 + dVar20;
      dVar35 = dVar35 + dVar26;
      if (lVar7 < cols) {
        lVar11 = 0;
        do {
          dVar20 = pdVar18[lVar7 + lVar11];
          dVar25 = dVar25 + pdVar13[lVar7 + lVar11] * dVar20;
          dVar23 = dVar23 + pdVar8[lVar7 + lVar11] * dVar20;
          dVar21 = dVar21 + pdVar17[lVar7 + lVar11] * dVar20;
          dVar35 = dVar35 + dVar20 * pdVar6[lVar7 + lVar11];
          lVar11 = lVar11 + 1;
        } while (cols - lVar7 != lVar11);
      }
      res[uVar5 * resIncr] = dVar25 * alpha + res[uVar5 * resIncr];
      lVar11 = (uVar5 + 1) * resIncr;
      res[lVar11] = dVar23 * alpha + res[lVar11];
      lVar11 = (uVar5 + 2) * resIncr;
      res[lVar11] = dVar21 * alpha + res[lVar11];
      lVar11 = (uVar5 + 3) * resIncr;
      res[lVar11] = dVar35 * alpha + res[lVar11];
      uVar5 = uVar5 + 4;
      pdVar13 = pdVar13 + lVar2 * 4;
      pdVar8 = pdVar8 + lVar2 * 4;
      pdVar17 = pdVar17 + lVar2 * 4;
      pdVar6 = pdVar6 + lVar2 * 4;
    } while ((long)uVar5 < rows + -3);
  }
  if ((long)uVar5 < rows + -1) {
    pdVar17 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0,_1>).m_data;
    pdVar13 = pdVar10 + uVar5 * lVar2;
    pdVar8 = pdVar10 + (uVar5 + 1) * lVar2;
    do {
      if (cols < 2) {
        dVar20 = 0.0;
        dVar21 = 0.0;
        dVar22 = 0.0;
        dVar35 = 0.0;
        lVar7 = 0;
      }
      else {
        dVar22 = 0.0;
        dVar35 = 0.0;
        dVar20 = 0.0;
        dVar21 = 0.0;
        lVar11 = 0;
        do {
          pdVar6 = pdVar17 + lVar11;
          dVar23 = *pdVar6;
          dVar24 = pdVar6[1];
          dVar20 = dVar20 + pdVar13[lVar11] * dVar23;
          dVar21 = dVar21 + (pdVar13 + lVar11)[1] * dVar24;
          dVar22 = dVar22 + pdVar8[lVar11] * dVar23;
          dVar35 = dVar35 + (pdVar8 + lVar11)[1] * dVar24;
          lVar7 = lVar11 + 2;
          lVar9 = lVar11 + 4;
          lVar11 = lVar7;
        } while (lVar9 <= cols);
      }
      dVar21 = dVar21 + dVar20;
      dVar35 = dVar35 + dVar22;
      if (lVar7 < cols) {
        do {
          dVar20 = pdVar17[lVar7];
          dVar21 = dVar21 + pdVar13[lVar7] * dVar20;
          dVar35 = dVar35 + dVar20 * pdVar8[lVar7];
          lVar7 = lVar7 + 1;
        } while (cols != lVar7);
      }
      res[uVar5 * resIncr] = dVar21 * alpha + res[uVar5 * resIncr];
      lVar11 = (uVar5 + 1) * resIncr;
      res[lVar11] = dVar35 * alpha + res[lVar11];
      uVar5 = uVar5 + 2;
      pdVar13 = pdVar13 + lVar2 * 2;
      pdVar8 = pdVar8 + lVar2 * 2;
    } while ((long)uVar5 < rows + -1);
  }
  if ((long)uVar5 < rows) {
    pdVar13 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0,_1>).m_data;
    pdVar10 = pdVar10 + lVar2 * uVar5;
    do {
      dVar35 = 0.0;
      dVar20 = 0.0;
      if (cols < 2) {
        lVar7 = 0;
      }
      else {
        lVar11 = 0;
        do {
          pdVar8 = pdVar13 + lVar11;
          dVar35 = dVar35 + pdVar10[lVar11] * *pdVar8;
          dVar20 = dVar20 + (pdVar10 + lVar11)[1] * pdVar8[1];
          lVar7 = lVar11 + 2;
          lVar9 = lVar11 + 4;
          lVar11 = lVar7;
        } while (lVar9 <= cols);
      }
      dVar20 = dVar20 + dVar35;
      if (lVar7 < cols) {
        do {
          dVar20 = dVar20 + pdVar10[lVar7] * pdVar13[lVar7];
          lVar7 = lVar7 + 1;
        } while (cols != lVar7);
      }
      res[uVar5 * resIncr] = dVar20 * alpha + res[uVar5 * resIncr];
      uVar5 = uVar5 + 1;
      pdVar10 = pdVar10 + lVar2;
    } while (uVar5 != rows);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,RowMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& alhs,
  const RhsMapper& rhs,
  ResScalar* res, Index resIncr,
  ResScalar alpha)
{
  // The following copy tells the compiler that lhs's attributes are not modified outside this function
  // This helps GCC to generate propoer code.
  LhsMapper lhs(alhs);

  eigen_internal_assert(rhs.stride()==1);
  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;
  conj_helper<LhsPacketHalf,RhsPacketHalf,ConjugateLhs,ConjugateRhs> pcj_half;
  conj_helper<LhsPacketQuarter,RhsPacketQuarter,ConjugateLhs,ConjugateRhs> pcj_quarter;

  // TODO: fine tune the following heuristic. The rationale is that if the matrix is very large,
  //       processing 8 rows at once might be counter productive wrt cache.
  const Index n8 = lhs.stride()*sizeof(LhsScalar)>32000 ? 0 : rows-7;
  const Index n4 = rows-3;
  const Index n2 = rows-1;

  // TODO: for padded aligned inputs, we could enable aligned reads
  enum { LhsAlignment = Unaligned,
         ResPacketSize = Traits::ResPacketSize,
         ResPacketSizeHalf = HalfTraits::ResPacketSize,
         ResPacketSizeQuarter = QuarterTraits::ResPacketSize,
         LhsPacketSize = Traits::LhsPacketSize,
         LhsPacketSizeHalf = HalfTraits::LhsPacketSize,
         LhsPacketSizeQuarter = QuarterTraits::LhsPacketSize,
         HasHalf = (int)ResPacketSizeHalf < (int)ResPacketSize,
         HasQuarter = (int)ResPacketSizeQuarter < (int)ResPacketSizeHalf
  };

  Index i=0;
  for(; i<n8; i+=8)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0)),
              c4 = pset1<ResPacket>(ResScalar(0)),
              c5 = pset1<ResPacket>(ResScalar(0)),
              c6 = pset1<ResPacket>(ResScalar(0)),
              c7 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
      c4 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+4,j),b0,c4);
      c5 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+5,j),b0,c5);
      c6 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+6,j),b0,c6);
      c7 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+7,j),b0,c7);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    ResScalar cc4 = predux(c4);
    ResScalar cc5 = predux(c5);
    ResScalar cc6 = predux(c6);
    ResScalar cc7 = predux(c7);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
      cc4 += cj.pmul(lhs(i+4,j), b0);
      cc5 += cj.pmul(lhs(i+5,j), b0);
      cc6 += cj.pmul(lhs(i+6,j), b0);
      cc7 += cj.pmul(lhs(i+7,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
    res[(i+4)*resIncr] += alpha*cc4;
    res[(i+5)*resIncr] += alpha*cc5;
    res[(i+6)*resIncr] += alpha*cc6;
    res[(i+7)*resIncr] += alpha*cc7;
  }
  for(; i<n4; i+=4)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
  }
  for(; i<n2; i+=2)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
  }
  for(; i<rows; ++i)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0));
    ResPacketHalf c0_h = pset1<ResPacketHalf>(ResScalar(0));
    ResPacketQuarter c0_q = pset1<ResPacketQuarter>(ResScalar(0));
    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket,Unaligned>(j,0);
      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i,j),b0,c0);
    }
    ResScalar cc0 = predux(c0);
    if (HasHalf) {
      for(; j+LhsPacketSizeHalf<=cols; j+=LhsPacketSizeHalf)
        {
          RhsPacketHalf b0 = rhs.template load<RhsPacketHalf,Unaligned>(j,0);
          c0_h = pcj_half.pmadd(lhs.template load<LhsPacketHalf,LhsAlignment>(i,j),b0,c0_h);
        }
      cc0 += predux(c0_h);
    }
    if (HasQuarter) {
      for(; j+LhsPacketSizeQuarter<=cols; j+=LhsPacketSizeQuarter)
        {
          RhsPacketQuarter b0 = rhs.template load<RhsPacketQuarter,Unaligned>(j,0);
          c0_q = pcj_quarter.pmadd(lhs.template load<LhsPacketQuarter,LhsAlignment>(i,j),b0,c0_q);
        }
      cc0 += predux(c0_q);
    }
    for(; j<cols; ++j)
    {
      cc0 += cj.pmul(lhs(i,j), rhs(j,0));
    }
    res[i*resIncr] += alpha*cc0;
  }
}